

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

void out_common(char *file,int line,char *func,int level,char *suffix,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *f;
  char errstr [128];
  char *sep;
  int ret;
  uint cc;
  char buf [8192];
  char *pcStack_38;
  int oerrno;
  char *fmt_local;
  char *suffix_local;
  int level_local;
  char *func_local;
  char *pcStack_10;
  int line_local;
  char *file_local;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  sep._4_4_ = 0;
  errstr._120_8_ = (long)"\n" + 1;
  memset(&f,0,0x80);
  if (file != (char *)0x0) {
    pcVar4 = strrchr(file,0x2f);
    pcStack_10 = file;
    if (pcVar4 != (char *)0x0) {
      pcStack_10 = pcVar4 + 1;
    }
    sep._4_4_ = out_snprintf((char *)&ret,0x2000,"<%s>: <%d> [%s:%d %s] ",Log_prefix,
                             (ulong)(uint)level,pcStack_10,line,func);
    if ((int)sep._4_4_ < 0) {
      (*Print)("out_snprintf failed");
      goto LAB_00102ac1;
    }
    if (sep._4_4_ < Log_alignment) {
      memset((void *)((long)&ret + (ulong)sep._4_4_),0x20,(ulong)(Log_alignment - sep._4_4_));
      sep._4_4_ = Log_alignment;
    }
  }
  if (fmt != (char *)0x0) {
    pcStack_38 = fmt;
    if (*fmt == '!') {
      pcStack_38 = fmt + 1;
      errstr._120_8_ = anon_var_dwarf_3be;
      piVar3 = __errno_location();
      util_strerror(*piVar3,(char *)&f,0x80);
    }
    iVar2 = (*Vsnprintf)((char *)((long)&ret + (ulong)sep._4_4_),
                         (long)sep._4_4_ * 0xffffffff + 0x2000,pcStack_38,ap);
    if (iVar2 < 0) {
      (*Print)("Vsnprintf failed");
      goto LAB_00102ac1;
    }
    sep._4_4_ = iVar2 + sep._4_4_;
  }
  out_snprintf((char *)((long)&ret + (ulong)sep._4_4_),(ulong)(0x2000 - sep._4_4_),"%s%s%s",
               errstr._120_8_,&f,suffix);
  (*Print)((char *)&ret);
LAB_00102ac1:
  piVar3 = __errno_location();
  *piVar3 = iVar1;
  return;
}

Assistant:

static void
out_common(const char *file, int line, const char *func, int level,
		const char *suffix, const char *fmt, va_list ap)
{
	int oerrno = errno;
	char buf[MAXPRINT];
	unsigned cc = 0;
	int ret;
	const char *sep = "";
	char errstr[UTIL_MAX_ERR_MSG] = "";

	if (file) {
		char *f = strrchr(file, OS_DIR_SEPARATOR);
		if (f)
			file = f + 1;
		ret = out_snprintf(&buf[cc], MAXPRINT - cc,
				"<%s>: <%d> [%s:%d %s] ",
				Log_prefix, level, file, line, func);
		if (ret < 0) {
			Print("out_snprintf failed");
			goto end;
		}
		cc += (unsigned)ret;
		if (cc < Log_alignment) {
			memset(buf + cc, ' ', Log_alignment - cc);
			cc = Log_alignment;
		}
	}

	if (fmt) {
		if (*fmt == '!') {
			fmt++;
			sep = ": ";
			util_strerror(errno, errstr, UTIL_MAX_ERR_MSG);
		}
		ret = Vsnprintf(&buf[cc], MAXPRINT - cc, fmt, ap);
		if (ret < 0) {
			Print("Vsnprintf failed");
			goto end;
		}
		cc += (unsigned)ret;
	}

	out_snprintf(&buf[cc], MAXPRINT - cc, "%s%s%s", sep, errstr, suffix);

	Print(buf);

end:
	errno = oerrno;
}